

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O1

size_t rtosc::path_search(Ports *root,char *m,size_t max_ports,char *msgbuf,size_t bufsize,
                         path_search_opts opts,bool reply_with_query)

{
  undefined8 len;
  undefined8 buffer;
  size_t sVar1;
  undefined4 in_register_0000008c;
  char *types;
  rtosc_arg_t *args;
  rtosc_arg_t rVar2;
  rtosc_arg_t rVar3;
  undefined8 uStack_70;
  rtosc_arg_t rStack_68;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_0000008c,opts);
  uStack_50 = 0x10629d;
  local_48._0_8_ = bufsize;
  local_48._8_8_ = msgbuf;
  rVar2 = rtosc_argument(m,0);
  uStack_50 = 0x1062ad;
  rVar3 = rtosc_argument(m,1);
  types = local_48 + -(max_ports * 2 + 0x10 & 0xfffffffffffffff0);
  args = (rtosc_arg_t *)(types + max_ports * -0x20);
  *(ulong *)(args + -1) = (ulong)reply_with_query;
  *(undefined8 *)((long)args + -0x18) = local_38;
  args[-2].h = max_ports * 2;
  *(undefined8 *)((long)args + -0x28) = 0x1062ff;
  path_search(root,rVar2.s,rVar3.s,types,max_ports * 2 + 1,args,args[-2].t,
              *(path_search_opts *)((long)args + -0x18),(bool)args[-1].T);
  buffer = local_48._8_8_;
  len = local_48._0_8_;
  *(undefined8 *)((long)args + -8) = 0x10631d;
  sVar1 = rtosc_amessage((char *)buffer,len,"/paths",types,args);
  return sVar1;
}

Assistant:

std::size_t rtosc::path_search(const Ports &root, const char *m,
                               std::size_t max_ports,
                               char *msgbuf, std::size_t bufsize,
                               path_search_opts opts, bool reply_with_query)
{
    const char *str    = rtosc_argument(m,0).s;
    const char *needle = rtosc_argument(m,1).s;
    size_t max_args    = max_ports << 1;
    size_t max_types   = max_args + 1;
    STACKALLOC(char, types, max_types);
    STACKALLOC(rtosc_arg_t, args, max_args);

    path_search(root, str, needle, types, max_types, args, max_args, opts, reply_with_query);
    size_t length = rtosc_amessage(msgbuf, bufsize,
                                   "/paths", types, args);
    return length;
}